

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall
ExtPubkey_DerivePubTweakTest_Test::~ExtPubkey_DerivePubTweakTest_Test
          (ExtPubkey_DerivePubTweakTest_Test *this)

{
  ExtPubkey_DerivePubTweakTest_Test *this_local;
  
  ~ExtPubkey_DerivePubTweakTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ExtPubkey, DerivePubTweakTest) {
  std::string ext_serial = "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0";
  ExtPubkey extkey = ExtPubkey(ByteData(ext_serial));

  std::vector<uint32_t> key_paths = {0, 5};
  ByteData256 tweak_sum;
  EXPECT_NO_THROW((tweak_sum = extkey.DerivePubTweak(key_paths)));
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("2f0b491d070c810a9779a8398063ba6e20302604dc36cf6bf6f935e34c68fa22", tweak_sum.GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS
}